

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

int op_granpos_add(ogg_int64_t *_dst_gp,ogg_int64_t _src_gp,opus_int32 _delta)

{
  int local_24;
  ogg_int64_t oStack_20;
  opus_int32 _delta_local;
  ogg_int64_t _src_gp_local;
  ogg_int64_t *_dst_gp_local;
  
  local_24 = _delta;
  oStack_20 = _src_gp;
  if (_delta < 1) {
    if (_delta < 0) {
      if ((-1 < _src_gp) && (_src_gp < -_delta)) {
        return -0x83;
      }
      if (_src_gp < -0x8000000000000000 - (long)_delta) {
        local_24 = (int)_src_gp + 1 + _delta;
        oStack_20 = 0x7fffffffffffffff;
      }
    }
  }
  else {
    if ((_src_gp < 0) && (-1 - _delta <= _src_gp)) {
      return -0x83;
    }
    if (0x7fffffffffffffff - (long)_delta < _src_gp) {
      local_24 = _delta + (int)_src_gp;
      oStack_20 = -0x8000000000000000;
    }
  }
  *_dst_gp = oStack_20 + local_24;
  return 0;
}

Assistant:

static int op_granpos_add(ogg_int64_t *_dst_gp,ogg_int64_t _src_gp,
 opus_int32 _delta){
  /*The code below handles this case correctly, but there's no reason we
     should ever be called with these values, so make sure we aren't.*/
  OP_ASSERT(_src_gp!=-1);
  if(_delta>0){
    /*Adding this amount to the granule position would overflow its 64-bit
       range.*/
    if(OP_UNLIKELY(_src_gp<0)&&OP_UNLIKELY(_src_gp>=-1-_delta))return OP_EINVAL;
    if(OP_UNLIKELY(_src_gp>OP_INT64_MAX-_delta)){
      /*Adding this amount to the granule position would overflow the positive
         half of its 64-bit range.
        Since signed overflow is undefined in C, do it in a way the compiler
         isn't allowed to screw up.*/
      _delta-=(opus_int32)(OP_INT64_MAX-_src_gp)+1;
      _src_gp=OP_INT64_MIN;
    }
  }
  else if(_delta<0){
    /*Subtracting this amount from the granule position would underflow its
       64-bit range.*/
    if(_src_gp>=0&&OP_UNLIKELY(_src_gp<-_delta))return OP_EINVAL;
    if(OP_UNLIKELY(_src_gp<OP_INT64_MIN-_delta)){
      /*Subtracting this amount from the granule position would underflow the
         negative half of its 64-bit range.
        Since signed underflow is undefined in C, do it in a way the compiler
         isn't allowed to screw up.*/
      _delta+=(opus_int32)(_src_gp-OP_INT64_MIN)+1;
      _src_gp=OP_INT64_MAX;
    }
  }
  *_dst_gp=_src_gp+_delta;
  return 0;
}